

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionTaperedTimoshenko.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric::ComputeInertiaDampingMatrix
          (ChBeamSectionTaperedTimoshenkoAdvancedGeneric *this,ChMatrixNM<double,_12,_12> *Ri,
          ChVector<double> *mW_A,ChVector<double> *mW_B)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  element_type *peVar4;
  element_type *peVar5;
  ChMatrixNM<double,_6,_6> Ri_A;
  ChMatrixNM<double,_6,_6> Ri_B;
  Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false> local_2d0;
  Matrix<double,_6,_6,_1,_6,_6> local_2a0;
  Matrix<double,_6,_6,_1,_6,_6> local_180;
  
  Eigen::PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>::setZero
            (&Ri->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>,0xc,0xc);
  bVar1 = this->compute_inertia_damping_matrix;
  if (bVar1 != false) {
    peVar4 = (this->sectionA).
             super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (peVar4->super_ChBeamSectionRayleighAdvancedGeneric).super_ChBeamSectionEulerAdvancedGeneric.
    super_ChBeamSectionEuler.compute_inertia_damping_matrix = bVar1;
    bVar2 = this->compute_inertia_stiffness_matrix;
    (peVar4->super_ChBeamSectionRayleighAdvancedGeneric).super_ChBeamSectionEulerAdvancedGeneric.
    super_ChBeamSectionEuler.compute_inertia_stiffness_matrix = bVar2;
    bVar3 = this->compute_Ri_Ki_by_num_diff;
    (peVar4->super_ChBeamSectionRayleighAdvancedGeneric).super_ChBeamSectionEulerAdvancedGeneric.
    super_ChBeamSectionEuler.compute_Ri_Ki_by_num_diff = bVar3;
    peVar5 = (this->sectionB).
             super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (peVar5->super_ChBeamSectionRayleighAdvancedGeneric).super_ChBeamSectionEulerAdvancedGeneric.
    super_ChBeamSectionEuler.compute_inertia_damping_matrix = bVar1;
    (peVar5->super_ChBeamSectionRayleighAdvancedGeneric).super_ChBeamSectionEulerAdvancedGeneric.
    super_ChBeamSectionEuler.compute_inertia_stiffness_matrix = bVar2;
    (peVar5->super_ChBeamSectionRayleighAdvancedGeneric).super_ChBeamSectionEulerAdvancedGeneric.
    super_ChBeamSectionEuler.compute_Ri_Ki_by_num_diff = bVar3;
    (**(code **)((long)(peVar4->super_ChBeamSectionRayleighAdvancedGeneric).
                       super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                       super_ChBeamSection._vptr_ChBeamSection + 0x70))(peVar4,&local_2a0,mW_A);
    peVar4 = (this->sectionB).
             super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (**(code **)((long)(peVar4->super_ChBeamSectionRayleighAdvancedGeneric).
                       super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                       super_ChBeamSection._vptr_ChBeamSection + 0x70))(peVar4,&local_180,mW_B);
    local_2d0.super_BlockImpl<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false,_true>.m_startRow.
    m_value = 0;
    local_2d0.super_BlockImpl<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false,_true>.m_startCol.
    m_value = 0;
    local_2d0.super_BlockImpl<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false,_true>.m_outerStride
         = 0xc;
    local_2d0.super_BlockImpl<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false>,_0>.m_data =
         (PointerType)Ri;
    local_2d0.super_BlockImpl<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false,_true>.m_xpr = Ri;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,12,1,12,12>,6,6,false>,Eigen::Matrix<double,6,6,1,6,6>>
              (&local_2d0,&local_2a0);
    local_2d0.super_BlockImpl<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false>,_0>.m_data =
         (Ri->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.
         array + 0x4e;
    local_2d0.super_BlockImpl<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false,_true>.m_startRow.
    m_value = 6;
    local_2d0.super_BlockImpl<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false,_true>.m_startCol.
    m_value = 6;
    local_2d0.super_BlockImpl<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false,_true>.m_outerStride
         = 0xc;
    local_2d0.super_BlockImpl<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false,_true>.m_xpr = Ri;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,12,1,12,12>,6,6,false>,Eigen::Matrix<double,6,6,1,6,6>>
              (&local_2d0,&local_180);
  }
  return;
}

Assistant:

void ChBeamSectionTaperedTimoshenkoAdvancedGeneric::ComputeInertiaDampingMatrix(ChMatrixNM<double, 12, 12>& Ri,
                                                                                const ChVector<>& mW_A,
                                                                                const ChVector<>& mW_B) {
    Ri.setZero(12, 12);

    if (this->compute_inertia_damping_matrix == false)
        return;

    this->sectionA->compute_inertia_damping_matrix = this->compute_inertia_damping_matrix;
    this->sectionA->compute_inertia_stiffness_matrix = this->compute_inertia_stiffness_matrix;
    this->sectionA->compute_Ri_Ki_by_num_diff = this->compute_Ri_Ki_by_num_diff;

    this->sectionB->compute_inertia_damping_matrix = this->compute_inertia_damping_matrix;
    this->sectionB->compute_inertia_stiffness_matrix = this->compute_inertia_stiffness_matrix;
    this->sectionB->compute_Ri_Ki_by_num_diff = this->compute_Ri_Ki_by_num_diff;

    ChMatrixNM<double, 6, 6> Ri_A;
    ChMatrixNM<double, 6, 6> Ri_B;
    this->sectionA->ComputeInertiaDampingMatrix(Ri_A, mW_A);
    this->sectionB->ComputeInertiaDampingMatrix(Ri_B, mW_B);

    Ri.block<6, 6>(0, 0) = Ri_A;
    Ri.block<6, 6>(6, 6) = Ri_B;
}